

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandReconcile(Abc_Frame_t *pAbc,int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  Io_FileType_t IVar3;
  Aig_Man_t *pAStack_50;
  int c;
  Aig_Man_t *pAig2;
  Aig_Man_t *pAig1;
  Abc_Ntk_t *pNtk2;
  Abc_Ntk_t *pNtk1;
  Abc_Cex_t *pCex;
  char **argv_local;
  Abc_Frame_t *pAStack_18;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk2 = (Abc_Ntk_t *)0x0;
  pAig1 = (Aig_Man_t *)0x0;
  pCex = (Abc_Cex_t *)argv;
  argv_local._4_4_ = argc;
  pAStack_18 = pAbc;
  Extra_UtilGetoptReset();
  iVar2 = Extra_UtilGetopt(argv_local._4_4_,(char **)pCex,"h");
  if (iVar2 == -1) {
    if ((argv_local._4_4_ == globalUtilOptind + 2) || (argv_local._4_4_ == globalUtilOptind)) {
      if (pAStack_18->pCex == (Abc_Cex_t *)0x0) {
        Abc_Print(1,"There is no current counter-example.\n");
        pAbc_local._4_4_ = 1;
      }
      else {
        if (argv_local._4_4_ == globalUtilOptind + 2) {
          pcVar1 = *(char **)(&pCex->iPo + (long)globalUtilOptind * 2);
          IVar3 = Io_ReadFileType(*(char **)(&pCex->iPo + (long)globalUtilOptind * 2));
          pNtk2 = Io_Read(pcVar1,IVar3,1,0);
          if (pNtk2 == (Abc_Ntk_t *)0x0) {
            return 1;
          }
          pcVar1 = *(char **)(&pCex->iPo + (long)(globalUtilOptind + 1) * 2);
          IVar3 = Io_ReadFileType(*(char **)(&pCex->iPo + (long)(globalUtilOptind + 1) * 2));
          pAig1 = (Aig_Man_t *)Io_Read(pcVar1,IVar3,1,0);
          if (pAig1 == (Aig_Man_t *)0x0) {
            Abc_NtkDelete(pNtk2);
            return 1;
          }
          pAig2 = Abc_NtkToDar(pNtk2,0,0);
          pAStack_50 = Abc_NtkToDar((Abc_Ntk_t *)pAig1,0,0);
        }
        else {
          if (argv_local._4_4_ != globalUtilOptind) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abc.c"
                          ,0x70c6,"int Abc_CommandReconcile(Abc_Frame_t *, int, char **)");
          }
          if (pAStack_18->pNtkCur == (Abc_Ntk_t *)0x0) {
            Abc_Print(1,"There is no AIG in the main-space.\n");
            return 0;
          }
          if (pAStack_18->pGia == (Gia_Man_t *)0x0) {
            Abc_Print(1,"There is no AIG in the &-space.\n");
            return 0;
          }
          pAig2 = Abc_NtkToDar(pAStack_18->pNtkCur,0,0);
          pAStack_50 = Gia_ManToAigSimple(pAStack_18->pGia);
        }
        pNtk1 = (Abc_Ntk_t *)Llb4_Nonlin4NormalizeCex(pAig2,pAStack_50,pAStack_18->pCex);
        Aig_ManStop(pAig2);
        Aig_ManStop(pAStack_50);
        if (pAig1 != (Aig_Man_t *)0x0) {
          Abc_NtkDelete((Abc_Ntk_t *)pAig1);
        }
        if (pNtk1 == (Abc_Ntk_t *)0x0) {
          Abc_Print(1,"Counter-example computation has failed.\n");
          if (pNtk2 != (Abc_Ntk_t *)0x0) {
            Abc_NtkDelete(pNtk2);
          }
          pAbc_local._4_4_ = 1;
        }
        else {
          if (pNtk2 != (Abc_Ntk_t *)0x0) {
            Abc_FrameReplaceCurrentNetwork(pAStack_18,pNtk2);
          }
          pAStack_18->nFrames = pNtk1->ntkFunc;
          Abc_FrameReplaceCex(pAStack_18,(Abc_Cex_t **)&pNtk1);
          pAbc_local._4_4_ = 0;
        }
      }
    }
    else {
      Abc_Print(1,"Does not seen to have two files names as arguments.\n");
      pAbc_local._4_4_ = 1;
    }
  }
  else {
    if (iVar2 != 0x68) {
      Abc_Print(-2,"Unknown switch.\n");
    }
    Abc_Print(-2,"usage: reconcile [-h] <fileOrigin> <fileReparam>\n");
    Abc_Print(-2,"\t        reconciles current CEX with <fileOrigin>\n");
    Abc_Print(-2,"\t        More specifically:\n");
    Abc_Print(-2,"\t        (i) assumes that <fileReparam> is an AIG derived by input\n");
    Abc_Print(-2,"\t        reparametrization of <fileOrigin> without seq synthesis;\n");
    Abc_Print(-2,"\t        (ii) assumes that current CEX is valid for <fileReparam>;\n");
    Abc_Print(-2,"\t        (iii) derives new CEX for <fileOrigin> and sets this CEX\n");
    Abc_Print(-2,"\t        and <fileOrigin> to be current CEX and current network\n");
    Abc_Print(-2,"\t<fileOrigin>   : file name with the original AIG\n");
    Abc_Print(-2,"\t<fileReparam>  : file name with the reparametrized AIG\n");
    Abc_Print(-2,"\t        (if both file names are not given on the command line,\n");
    Abc_Print(-2,"\t        original/reparam AIG has to be in the main-space/&-space)\n");
    Abc_Print(-2,"\t-h    : print the command usage\n");
    pAbc_local._4_4_ = 1;
  }
  return pAbc_local._4_4_;
}

Assistant:

int Abc_CommandReconcile( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Abc_Cex_t * Llb4_Nonlin4NormalizeCex( Aig_Man_t * pAigOrg, Aig_Man_t * pAigRpm, Abc_Cex_t * pCexRpm );
    Abc_Cex_t * pCex;
    Abc_Ntk_t * pNtk1 = NULL, * pNtk2 = NULL;
    Aig_Man_t * pAig1 = NULL, * pAig2 = NULL;
    int c;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
        case 'h':
            goto usage;
        default:
            Abc_Print( -2, "Unknown switch.\n");
            goto usage;
        }
    }

    if ( argc != globalUtilOptind + 2 && argc != globalUtilOptind )
    {
        Abc_Print( 1,"Does not seen to have two files names as arguments.\n" );
        return 1;
    }
    if ( pAbc->pCex == NULL )
    {
        Abc_Print( 1,"There is no current counter-example.\n" );
        return 1;
    }

    if ( argc == globalUtilOptind + 2 )
    {
        // derive networks
        pNtk1 = Io_Read( argv[globalUtilOptind], Io_ReadFileType(argv[globalUtilOptind]), 1, 0 );
        if ( pNtk1 == NULL )
            return 1;
        pNtk2 = Io_Read( argv[globalUtilOptind+1], Io_ReadFileType(argv[globalUtilOptind+1]), 1, 0 );
        if ( pNtk2 == NULL )
        {
            Abc_NtkDelete( pNtk1 );
            return 1;
        }
        // create counter-examples
        pAig1 = Abc_NtkToDar( pNtk1, 0, 0 );
        pAig2 = Abc_NtkToDar( pNtk2, 0, 0 );
    }
    else if ( argc == globalUtilOptind )
    {
        if ( pAbc->pNtkCur == NULL )
        {
            Abc_Print( 1, "There is no AIG in the main-space.\n");
            return 0;
        }
        if ( pAbc->pGia == NULL )
        {
            Abc_Print( 1, "There is no AIG in the &-space.\n");
            return 0;
        }
        // create counter-examples
        pAig1 = Abc_NtkToDar( pAbc->pNtkCur, 0, 0 );
        pAig2 = Gia_ManToAigSimple( pAbc->pGia );
    }
    else assert( 0 );
    pCex = Llb4_Nonlin4NormalizeCex( pAig1, pAig2, pAbc->pCex );
    Aig_ManStop( pAig1 );
    Aig_ManStop( pAig2 );
    if ( pNtk2 )  Abc_NtkDelete( pNtk2 );
    if ( pCex == NULL )
    {
        Abc_Print( 1,"Counter-example computation has failed.\n" );
        if ( pNtk1 )  Abc_NtkDelete( pNtk1 );
        return 1;
    }

    // replace the current network
    if ( pNtk1 )
        Abc_FrameReplaceCurrentNetwork( pAbc, pNtk1 );
    // update the counter-example
    pAbc->nFrames = pCex->iFrame;
    Abc_FrameReplaceCex( pAbc, &pCex );
    return 0;

usage:
    Abc_Print( -2, "usage: reconcile [-h] <fileOrigin> <fileReparam>\n" );
    Abc_Print( -2, "\t        reconciles current CEX with <fileOrigin>\n" );
    Abc_Print( -2, "\t        More specifically:\n" );
    Abc_Print( -2, "\t        (i) assumes that <fileReparam> is an AIG derived by input\n" );
    Abc_Print( -2, "\t        reparametrization of <fileOrigin> without seq synthesis;\n" );
    Abc_Print( -2, "\t        (ii) assumes that current CEX is valid for <fileReparam>;\n" );
    Abc_Print( -2, "\t        (iii) derives new CEX for <fileOrigin> and sets this CEX\n" );
    Abc_Print( -2, "\t        and <fileOrigin> to be current CEX and current network\n" );
    Abc_Print( -2, "\t<fileOrigin>   : file name with the original AIG\n");
    Abc_Print( -2, "\t<fileReparam>  : file name with the reparametrized AIG\n");
    Abc_Print( -2, "\t        (if both file names are not given on the command line,\n");
    Abc_Print( -2, "\t        original/reparam AIG has to be in the main-space/&-space)\n");
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}